

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O3

size_t fnet_socket_bind_all(fnet_sock_t sock_type,fnet_socket_t *ifaces,size_t size,int flags)

{
  int iVar1;
  fnet_socket_t __fd;
  int iVar2;
  size_t sVar3;
  long *plVar4;
  int broadcast_enable;
  ifaddrs *ifaddr;
  undefined4 local_44;
  long *local_40;
  fnet_socket_t *local_38;
  
  local_38 = ifaces;
  iVar1 = getifaddrs(&local_40);
  if (iVar1 == -1) {
    sVar3 = 0;
  }
  else {
    if (size == 0 || local_40 == (long *)0x0) {
      sVar3 = 0;
    }
    else {
      iVar1 = (uint)(sock_type == FNET_SOCK_DGRAM) * 3 + -1;
      if (sock_type == FNET_SOCK_STREAM) {
        iVar1 = 1;
      }
      sVar3 = 0;
      plVar4 = local_40;
      do {
        if ((((short *)plVar4[3] != (short *)0x0) && (*(short *)plVar4[3] == 2)) &&
           (__fd = socket(2,iVar1,0), __fd != 0xffffffff)) {
          if ((flags & 1U) == 0) {
LAB_00102fe7:
            iVar2 = bind(__fd,(sockaddr *)plVar4[3],0x10);
            if (-1 < iVar2) {
              local_38[sVar3] = __fd;
              sVar3 = sVar3 + 1;
              goto LAB_00103012;
            }
          }
          else {
            local_44 = 1;
            iVar2 = setsockopt(__fd,1,6,&local_44,4);
            if (-1 < iVar2) goto LAB_00102fe7;
          }
          close(__fd);
        }
LAB_00103012:
        plVar4 = (long *)*plVar4;
      } while ((plVar4 != (long *)0x0) && (sVar3 < size));
    }
    freeifaddrs(local_40);
  }
  return sVar3;
}

Assistant:

size_t fnet_socket_bind_all(fnet_sock_t sock_type, fnet_socket_t *ifaces, size_t size, int flags)
{
    struct ifaddrs *ifaddr, *ifa;

    if (getifaddrs(&ifaddr) == -1)
    {
        FLOG_ERR("getifaddrs failed");
        return 0;
    }

    size_t ifaces_num = 0;

    for (ifa = ifaddr; ifa != NULL; ifa = ifa->ifa_next)
    {
        if (ifaces_num >= size)
            break;

        if (!ifa->ifa_addr)
            continue;

        if (ifa->ifa_addr->sa_family != AF_INET)
            continue;

        // create socket
        fnet_socket_t socket = fnet_socket_create(sock_type);
        if (socket == FNET_INVALID_SOCKET)
        {
            FLOG_ERR("Unable to create socket");
            continue;
        }

        // set flags
        if (flags & FNET_SOCK_BROADCAST)
        {
            int broadcast_enable = 1;
            if(setsockopt(socket, SOL_SOCKET, SO_BROADCAST, &broadcast_enable, sizeof(broadcast_enable)) < 0)
            {
                FLOG_ERR("broadcast options");
                fnet_socket_close(socket);
                continue;
            }
        }

        if (bind(socket, (struct sockaddr_in const *)ifa->ifa_addr, sizeof(struct sockaddr_in)) < 0)
        {
            FLOG_ERR("Socket bind error");
            fnet_socket_close(socket);
            continue;
        }

        // remember
        ifaces[ifaces_num++] = socket;
    }

    freeifaddrs(ifaddr);

    FLOG_INFO("Ifaces: %d\n", ifaces_num);

    return ifaces_num;
}